

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_ctor_copy(void)

{
  undefined8 local_40;
  undefined4 local_34;
  
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0x23,"void api_dynamic_suite::dynamic_ctor_copy()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0x25,"void api_dynamic_suite::dynamic_ctor_copy()",&local_40,&local_34);
  return;
}

Assistant:

void dynamic_ctor_copy()
{
    static_assert(std::is_copy_constructible<vista::span<int>>::value, "span<int> must be copy-constructible");
    static_assert(std::is_nothrow_copy_constructible<vista::span<int>>::value, "span<int> must be nothrow copy-constructible");

    vista::span<int> span;
    BOOST_TEST_EQ(span.size(), 0);
    vista::span<int> clone(span);
    BOOST_TEST_EQ(clone.size(), 0);
}